

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O0

lzma_ret delta_encode(lzma_coder_conflict4 *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  size_t sVar1;
  bool bVar2;
  size_t local_70;
  size_t out_start;
  size_t size;
  size_t out_avail;
  size_t in_avail;
  lzma_ret ret;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_coder_conflict4 *coder_local;
  
  if ((coder->next).code == (lzma_code_function_conflict)0x0) {
    local_70 = out_size - *out_pos;
    if (in_size - *in_pos < local_70) {
      local_70 = in_size - *in_pos;
    }
    copy_and_encode(coder,in + *in_pos,out + *out_pos,local_70);
    *in_pos = local_70 + *in_pos;
    *out_pos = local_70 + *out_pos;
    bVar2 = false;
    if (action != LZMA_RUN) {
      bVar2 = *in_pos == in_size;
    }
    in_avail._4_4_ = (lzma_ret)bVar2;
  }
  else {
    sVar1 = *out_pos;
    in_avail._4_4_ =
         (*(coder->next).code)
                   ((lzma_coder_conflict *)(coder->next).coder,allocator,in,in_pos,in_size,out,
                    out_pos,out_size,action);
    encode_in_place(coder,out + sVar1,*out_pos - sVar1);
  }
  return in_avail._4_4_;
}

Assistant:

static lzma_ret
delta_encode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	lzma_ret ret;

	if (coder->next.code == NULL) {
		const size_t in_avail = in_size - *in_pos;
		const size_t out_avail = out_size - *out_pos;
		const size_t size = my_min(in_avail, out_avail);

		copy_and_encode(coder, in + *in_pos, out + *out_pos, size);

		*in_pos += size;
		*out_pos += size;

		ret = action != LZMA_RUN && *in_pos == in_size
				? LZMA_STREAM_END : LZMA_OK;

	} else {
		const size_t out_start = *out_pos;

		ret = coder->next.code(coder->next.coder, allocator,
				in, in_pos, in_size, out, out_pos, out_size,
				action);

		encode_in_place(coder, out + out_start, *out_pos - out_start);
	}

	return ret;
}